

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O1

void __thiscall
crnlib::dxt1_endpoint_optimizer::optimize_endpoints
          (dxt1_endpoint_optimizer *this,vec3F *low_color,vec3F *high_color)

{
  void *pvVar1;
  float fVar2;
  float fVar3;
  uint8 auVar4 [2];
  uint8 auVar5 [2];
  ushort uVar6;
  uint uVar7;
  unique_color *puVar8;
  uint64 uVar9;
  uchar *puVar10;
  dxt1_block dVar11;
  void *pvVar12;
  vec3F *pvVar13;
  undefined4 uVar14;
  uint16 uVar15;
  uint i;
  int iVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  uint b;
  int a;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  unsigned_short temp_3;
  int iVar23;
  uint g;
  unsigned_short temp;
  uint c;
  dxt1_solution_coordinates *coords;
  unsigned_short temp_4;
  int iVar24;
  ulong uVar25;
  bool bVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar29 [16];
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  dxt1_solution_coordinates coords_2;
  vec<3U,_float> result_3;
  vec<3U,_float> result_6;
  dxt1_solution_coordinates coords_4;
  vec3F initial_probe_high_color;
  vector<crnlib::unique_color_projection> evaluated_color_projections;
  int prev_packed_color [2];
  vec3F scaled_principle_axis [2];
  vec3F initial_probe_low_color;
  int d [3];
  vec3F orig_high_color;
  vec3F orig_low_color;
  uint probe_high [31];
  uint probe_low [31];
  dxt1_block local_230;
  dxt1_block local_228;
  float local_220;
  dxt1_block local_21c;
  float local_210;
  dxt1_solution_coordinates local_20c;
  dxt1_block local_208;
  float local_200;
  uint local_1fc;
  elemental_vector local_1f8;
  vec3F *local_1e8;
  ulong local_1e0;
  vec3F *local_1d8;
  uint local_1d0 [4];
  undefined *local_1c0;
  ulong local_1b8;
  int local_1ac;
  void *local_1a8;
  uint local_1a0;
  undefined8 local_19c;
  float local_194;
  dxt1_block local_18c;
  dxt1_endpoint_optimizer *local_180;
  int local_174 [3];
  uint64 local_168;
  ulong local_160;
  vec3F local_158;
  vec3F local_148;
  uint auStack_138 [32];
  uint auStack_b8 [34];
  
  local_148.m_s[2] = low_color->m_s[2];
  local_148.m_s._0_8_ = *(undefined8 *)low_color->m_s;
  local_158.m_s[2] = high_color->m_s[2];
  local_158.m_s._0_8_ = *(undefined8 *)high_color->m_s;
  (this->m_trial_solution).m_coords.m_low_color = 0;
  (this->m_trial_solution).m_coords.m_high_color = 0;
  if ((this->m_trial_solution).m_selectors.m_size != 0) {
    (this->m_trial_solution).m_selectors.m_size = 0;
  }
  (this->m_trial_solution).m_error = 0xffffffffffffffff;
  (this->m_trial_solution).m_alpha_block = false;
  uVar20 = (ulong)this->m_pParams->m_quality;
  if (uVar20 < 4) {
    local_230.m_selectors = *(uint8 (*) [4])(&DAT_001ba860 + uVar20 * 4);
    local_1b8 = *(ulong *)(&DAT_001ba980 + uVar20 * 8);
    local_1c0 = &DAT_001ba970 + *(int *)(&DAT_001ba970 + uVar20 * 4);
    local_1d0[3] = *(int *)(&DAT_001ba870 + uVar20 * 4);
  }
  else {
    local_1d0[3] = 4;
    local_1c0 = g_uber_probe_table;
    local_1b8 = 0xf;
    local_230.m_selectors[0] = '\0';
    local_230.m_selectors[1] = '\0';
    local_230.m_selectors[2] = 0x80;
    local_230.m_selectors[3] = '<';
  }
  local_1e8 = high_color;
  local_1d8 = low_color;
  if (this->m_pParams->m_endpoint_caching == true) {
    uVar17 = this->m_num_prev_results;
    if (uVar17 != 0) {
      uVar20 = 4;
      if (uVar17 < 4) {
        uVar20 = (ulong)uVar17;
      }
      coords = this->m_prev_results;
      do {
        evaluate_solution(this,coords,false);
        coords = coords + 1;
        uVar20 = uVar20 - 1;
      } while (uVar20 != 0);
    }
    if ((this->m_best_solution).m_error == 0) {
      return_solution(this);
      return;
    }
  }
  pvVar13 = local_1e8;
  if (cCRNDXTQualityNormal < this->m_pParams->m_quality) {
    try_median4(this,&local_148,&local_158);
  }
  lVar18 = 0;
  do {
    *(float *)((long)&local_1f8.m_p + lVar18 * 4) =
         (this->m_principle_axis).m_s[lVar18] * (float)local_230.m_selectors;
    lVar18 = lVar18 + 1;
  } while (lVar18 != 3);
  local_19c = CONCAT44((float)((ulong)local_1f8.m_p >> 0x20) * 63.0,SUB84(local_1f8.m_p,0) * 31.0);
  local_194 = (float)local_1f8.m_size * 31.0;
  lVar18 = 0;
  do {
    *(uint *)((long)&local_1f8.m_p + lVar18 * 4) =
         *(uint *)((long)&local_19c + lVar18 * 4) ^ 0x80000000;
    lVar18 = lVar18 + 1;
  } while (lVar18 != 3);
  local_1a0 = local_1f8.m_size;
  local_1a8 = local_1f8.m_p;
  auVar29 = ZEXT816(0x427c000041f80000);
  fVar27 = (float)*(undefined8 *)local_1d8->m_s * auVar29._0_4_;
  fVar28 = (float)((ulong)*(undefined8 *)local_1d8->m_s >> 0x20) * auVar29._4_4_;
  auVar31._0_12_ = ZEXT812(0x427c000041f80000);
  auVar31._12_4_ = 0;
  auVar32._4_4_ = fVar28;
  auVar32._0_4_ = fVar27;
  auVar32._8_8_ = 0;
  auVar32 = minps(auVar31,auVar32);
  *(ulong *)local_1d8->m_s =
       CONCAT44(-(uint)(0.0 <= fVar28) & auVar32._4_4_,-(uint)(0.0 <= fVar27) & auVar32._0_4_);
  fVar28 = local_1d8->m_s[2] * 31.0;
  fVar27 = 31.0;
  if (fVar28 <= 31.0) {
    fVar27 = fVar28;
  }
  local_1d8->m_s[2] = (float)(~-(uint)(fVar28 < 0.0) & (uint)fVar27);
  auVar33._0_4_ = (float)*(undefined8 *)pvVar13->m_s * auVar29._0_4_;
  auVar33._4_4_ = (float)((ulong)*(undefined8 *)pvVar13->m_s >> 0x20) * auVar29._4_4_;
  auVar33._8_8_ = 0;
  auVar32 = minps(auVar29,auVar33);
  pvVar13->m_s[0] = (float)(-(uint)(0.0 <= auVar33._0_4_) & auVar32._0_4_);
  pvVar13->m_s[1] = (float)(-(uint)(0.0 <= auVar33._4_4_) & auVar32._4_4_);
  fVar28 = pvVar13->m_s[2] * 31.0;
  fVar27 = 31.0;
  if (fVar28 <= 31.0) {
    fVar27 = fVar28;
  }
  pvVar13->m_s[2] = (float)(~-(uint)(fVar28 < 0.0) & (uint)fVar27);
  bVar26 = (this->m_perceptual & 1U) != 0;
  iVar23 = 1;
  if (bVar26) {
    iVar23 = 0x19;
  }
  iVar24 = 0x10;
  if (!bVar26) {
    iVar24 = 2;
  }
  lVar18 = 0;
  do {
    iVar16 = iVar23;
    if (((int)lVar18 != 1) && (iVar16 = 2, (int)lVar18 == 0)) {
      iVar16 = iVar24;
    }
    fVar27 = (float)iVar16 * (local_1e8->m_s[lVar18] - local_1d8->m_s[lVar18]);
    if (0.0 <= fVar27) {
      fVar27 = floorf(fVar27 + 0.5);
    }
    else {
      fVar27 = floorf(0.5 - fVar27);
      fVar27 = -fVar27;
    }
    local_174[lVar18] = (int)fVar27;
    lVar18 = lVar18 + 1;
  } while (lVar18 != 3);
  uVar7 = (this->m_evaluated_colors).m_size;
  local_1f8.m_p = (void *)0x0;
  local_1f8.m_size = 0;
  local_1f8.m_capacity = 0;
  if (uVar7 != 0) {
    elemental_vector::increase_capacity
              (&local_1f8,uVar7,uVar7 == 1,0x10,
               vector<crnlib::unique_color_projection>::object_mover,false);
    local_1f8.m_size = uVar7;
  }
  pvVar12 = local_1f8.m_p;
  if ((this->m_evaluated_colors).m_size != 0) {
    fVar27 = local_1e8->m_s[0];
    fVar28 = local_1d8->m_s[0];
    fVar30 = (local_1e8->m_s[1] + local_1d8->m_s[1]) * (float)local_174[1];
    fVar2 = local_1e8->m_s[2];
    fVar3 = local_1d8->m_s[2];
    lVar18 = 2;
    uVar20 = 0;
    do {
      puVar8 = (this->m_evaluated_colors).m_p;
      *(ulong *)((long)local_1f8.m_p + lVar18 * 2 + 4) =
           (ulong)*(uint *)((long)&(puVar8->m_color).field_0 + lVar18 + 2) *
           ((long)(int)((uint)(puVar8->m_color).field_0.c[lVar18] * local_174[2] +
                       (uint)*(byte *)((long)puVar8 + lVar18 + -1) * local_174[1] +
                       (uint)*(byte *)((long)puVar8 + lVar18 + -2) * local_174[0]) -
           (long)((fVar2 + fVar3) * (float)local_174[2] * 4.0 +
                 fVar30 + fVar30 + (fVar27 + fVar28) * (float)local_174[0] * 4.0));
      puVar8 = (this->m_evaluated_colors).m_p;
      *(undefined1 *)((long)local_1f8.m_p + lVar18 * 2 + -4) =
           *(undefined1 *)((long)puVar8 + lVar18 + -2);
      *(undefined1 *)((long)local_1f8.m_p + lVar18 * 2 + -3) =
           *(undefined1 *)((long)puVar8 + lVar18 + -1);
      *(uchar *)((long)local_1f8.m_p + lVar18 * 2 + -2) = (puVar8->m_color).field_0.c[lVar18];
      *(uchar *)((long)local_1f8.m_p + lVar18 * 2 + -1) = (puVar8->m_color).field_0.c[lVar18 + 1];
      *(undefined4 *)((long)local_1f8.m_p + lVar18 * 2) =
           *(undefined4 *)((long)&(puVar8->m_color).field_0 + lVar18 + 2);
      uVar20 = uVar20 + 1;
      lVar18 = lVar18 + 8;
    } while (uVar20 < (this->m_evaluated_colors).m_size);
  }
  uVar7 = local_1f8.m_size;
  uVar20 = local_1f8._8_8_ & 0xffffffff;
  if (uVar20 != 0) {
    pvVar1 = (void *)((long)local_1f8.m_p + uVar20 * 0x10);
    lVar18 = 0x3f;
    if (uVar20 != 0) {
      for (; local_1f8.m_size >> lVar18 == 0; lVar18 = lVar18 + -1) {
      }
    }
    std::
    __introsort_loop<crnlib::unique_color_projection*,long,__gnu_cxx::__ops::_Iter_comp_iter<crnlib::__0>>
              (local_1f8.m_p,pvVar1,((uint)lVar18 ^ 0x3f) * 2 ^ 0x7e);
    if (uVar7 < 0x11) {
      std::
      __insertion_sort<crnlib::unique_color_projection*,__gnu_cxx::__ops::_Iter_comp_iter<crnlib::__0>>
                (pvVar12,pvVar1);
    }
    else {
      lVar18 = (long)pvVar12 + 0x100;
      std::
      __insertion_sort<crnlib::unique_color_projection*,__gnu_cxx::__ops::_Iter_comp_iter<crnlib::__0>>
                (pvVar12,lVar18);
      lVar21 = uVar20 * 0x10 + -0x100;
      do {
        std::
        __unguarded_linear_insert<crnlib::unique_color_projection*,__gnu_cxx::__ops::_Val_comp_iter<crnlib::__0>>
                  (lVar18);
        lVar18 = lVar18 + 0x10;
        lVar21 = lVar21 + -0x10;
      } while (lVar21 != 0);
    }
  }
  uVar17 = (this->m_evaluated_colors).m_size;
  if ((ulong)uVar17 != 0) {
    uVar20 = 0;
    do {
      uVar25 = uVar20 >> 1 & 0x7fffffff;
      uVar19 = (ulong)(~(uint)uVar25 + uVar17);
      if ((uVar20 & 1) != 0) {
        uVar19 = uVar25;
      }
      lVar18 = uVar19 * 0x10;
      puVar8 = (this->m_evaluated_colors).m_p;
      puVar8[uVar20].m_color.field_0.field_0.r = *(uchar *)((long)local_1f8.m_p + lVar18);
      puVar8[uVar20].m_color.field_0.field_0.g = *(uchar *)((long)local_1f8.m_p + lVar18 + 1);
      puVar8[uVar20].m_color.field_0.field_0.b = *(uchar *)((long)local_1f8.m_p + lVar18 + 2);
      puVar8[uVar20].m_color.field_0.field_0.a = *(uchar *)((long)local_1f8.m_p + lVar18 + 3);
      puVar8[uVar20].m_weight = *(uint *)((long)local_1f8.m_p + lVar18 + 4);
      uVar20 = uVar20 + 1;
    } while (uVar17 != uVar20);
  }
  iVar23 = 0;
  local_180 = this;
  while( true ) {
    pvVar13 = local_1e8;
    if (iVar23 != 0) {
      dxt1_block::unpack_color(&local_18c,(this->m_best_solution).m_coords.m_low_color,false,0xff);
      *(ulong *)local_1d8->m_s =
           CONCAT44((float)((uint)local_18c._0_4_ >> 8 & 0xff),(float)(local_18c._0_4_ & 0xff));
      local_1d8->m_s[2] = (float)((uint)local_18c._0_4_ >> 0x10 & 0xff);
      dxt1_block::unpack_color(&local_208,(this->m_best_solution).m_coords.m_high_color,false,0xff);
      uVar17 = (uint)local_208.m_high_color[0];
      *(ulong *)pvVar13->m_s =
           CONCAT44((float)local_208.m_low_color[1],(float)(local_208._0_4_ & 0xff));
      pvVar13->m_s[2] = (float)uVar17;
    }
    uVar9 = (this->m_best_solution).m_error;
    if (uVar9 == 0) break;
    local_168 = uVar9;
    local_1ac = iVar23;
    local_1d0[0] = 0xffffffff;
    local_1d0[1] = 0xffffffff;
    local_208.m_low_color[0] = '\0';
    local_208.m_low_color[1] = '\0';
    local_208.m_high_color[0] = '\0';
    local_208.m_high_color[1] = '?';
    local_208.m_selectors[0] = '\0';
    local_208.m_selectors[1] = '\0';
    local_208.m_selectors[2] = '\0';
    local_208.m_selectors[3] = '?';
    local_200 = 0.5;
    lVar18 = 0;
    do {
      *(float *)(local_18c.m_low_color + lVar18 * 4) =
           local_1d8->m_s[lVar18] + *(float *)(local_208.m_low_color + lVar18 * 4);
      lVar18 = lVar18 + 1;
    } while (lVar18 != 3);
    uVar20 = 0;
    local_1fc = 0;
    do {
      local_210 = (float)(int)*(short *)(local_1c0 + uVar20 * 2);
      lVar18 = (long)&local_1a8 + (ulong)(uVar20 == 0) * 0xc;
      uVar19 = (ulong)(uVar20 == 0);
      local_1e0 = uVar20;
      do {
        lVar21 = 0;
        do {
          *(float *)(local_228.m_low_color + lVar21 * 4) =
               *(float *)(lVar18 + lVar21 * 4) * local_210;
          lVar21 = lVar21 + 1;
        } while (lVar21 != 3);
        lVar21 = 0;
        do {
          *(float *)(local_208.m_low_color + lVar21 * 4) =
               *(float *)(local_18c.m_low_color + lVar21 * 4) +
               *(float *)(local_228.m_low_color + lVar21 * 4);
          dVar11 = local_208;
          lVar21 = lVar21 + 1;
        } while (lVar21 != 3);
        local_230.m_selectors[0] = local_208.m_selectors[0];
        local_230.m_selectors[1] = local_208.m_selectors[1];
        local_230.m_selectors[2] = local_208.m_selectors[2];
        local_230.m_selectors[3] = local_208.m_selectors[3];
        uVar14 = local_208._0_4_;
        local_208 = dVar11;
        fVar27 = floorf((float)uVar14);
        iVar23 = (int)fVar27;
        if (0x1e < iVar23) {
          iVar23 = 0x1f;
        }
        if (iVar23 < 1) {
          iVar23 = 0;
        }
        fVar27 = floorf((float)local_230.m_selectors);
        iVar24 = (int)fVar27;
        if (0x3e < iVar24) {
          iVar24 = 0x3f;
        }
        if (iVar24 < 1) {
          iVar24 = 0;
        }
        fVar27 = floorf(local_200);
        uVar17 = (uint)fVar27;
        if (0x1e < (int)uVar17) {
          uVar17 = 0x1f;
        }
        if ((int)uVar17 < 1) {
          uVar17 = 0;
        }
        uVar17 = iVar23 << 0xb | iVar24 << 5 | uVar17;
        if (uVar17 != local_1d0[uVar19]) {
          uVar20 = (ulong)local_1fc;
          local_1fc = local_1fc + 1;
          auStack_b8[uVar20] = uVar17;
          local_1d0[uVar19] = uVar17;
        }
        lVar18 = lVar18 + 0xc;
        bVar26 = uVar19 == 0;
        uVar19 = uVar19 + 1;
      } while (bVar26);
      uVar20 = local_1e0 + 1;
    } while (uVar20 != local_1b8);
    local_1d0[0] = 0xffffffff;
    local_1d0[1] = 0xffffffff;
    local_228.m_low_color[0] = '\0';
    local_228.m_low_color[1] = '\0';
    local_228.m_high_color[0] = '\0';
    local_228.m_high_color[1] = '?';
    local_228.m_selectors[0] = '\0';
    local_228.m_selectors[1] = '\0';
    local_228.m_selectors[2] = '\0';
    local_228.m_selectors[3] = '?';
    local_220 = 0.5;
    lVar18 = 0;
    do {
      *(float *)(local_208.m_low_color + lVar18 * 4) =
           local_1e8->m_s[lVar18] + *(float *)(local_228.m_low_color + lVar18 * 4);
      lVar18 = lVar18 + 1;
    } while (lVar18 != 3);
    uVar20 = 0;
    local_1e0 = local_1e0 & 0xffffffff00000000;
    do {
      local_160 = uVar20;
      local_210 = (float)(int)*(short *)(local_1c0 + uVar20 * 2);
      lVar18 = (long)&local_1a8 + (ulong)(uVar20 == 0) * 0xc;
      uVar20 = (ulong)(uVar20 == 0);
      do {
        lVar21 = 0;
        do {
          *(float *)(local_21c.m_low_color + lVar21 * 4) =
               *(float *)(lVar18 + lVar21 * 4) * local_210;
          lVar21 = lVar21 + 1;
        } while (lVar21 != 3);
        lVar21 = 0;
        do {
          *(float *)(local_228.m_low_color + lVar21 * 4) =
               *(float *)(local_208.m_low_color + lVar21 * 4) +
               *(float *)(local_21c.m_low_color + lVar21 * 4);
          dVar11 = local_228;
          lVar21 = lVar21 + 1;
        } while (lVar21 != 3);
        local_230.m_selectors[0] = local_228.m_selectors[0];
        local_230.m_selectors[1] = local_228.m_selectors[1];
        local_230.m_selectors[2] = local_228.m_selectors[2];
        local_230.m_selectors[3] = local_228.m_selectors[3];
        uVar14 = local_228._0_4_;
        local_228 = dVar11;
        fVar27 = floorf((float)uVar14);
        iVar23 = (int)fVar27;
        if (0x1e < iVar23) {
          iVar23 = 0x1f;
        }
        if (iVar23 < 1) {
          iVar23 = 0;
        }
        fVar27 = floorf((float)local_230.m_selectors);
        iVar24 = (int)fVar27;
        if (0x3e < iVar24) {
          iVar24 = 0x3f;
        }
        if (iVar24 < 1) {
          iVar24 = 0;
        }
        fVar27 = floorf(local_220);
        uVar17 = (uint)fVar27;
        if (0x1e < (int)uVar17) {
          uVar17 = 0x1f;
        }
        if ((int)uVar17 < 1) {
          uVar17 = 0;
        }
        uVar17 = iVar23 << 0xb | iVar24 << 5 | uVar17;
        if (uVar17 != local_1d0[uVar20]) {
          uVar19 = local_1e0 & 0xffffffff;
          local_1e0 = CONCAT44(local_1e0._4_4_,(int)local_1e0 + 1);
          auStack_138[uVar19] = uVar17;
          local_1d0[uVar20] = uVar17;
        }
        lVar18 = lVar18 + 0xc;
        bVar26 = uVar20 == 0;
        uVar20 = uVar20 + 1;
      } while (bVar26);
      uVar20 = local_160 + 1;
    } while (uVar20 != local_1b8);
    if (local_1fc != 0) {
      uVar19 = (ulong)local_1fc;
      uVar20 = local_1e0 & 0xffffffff;
      uVar25 = 0;
      do {
        if ((int)local_1e0 != 0) {
          auVar4 = *(uint8 (*) [2])(auStack_b8 + uVar25);
          uVar22 = 0;
          do {
            auVar5 = *(uint8 (*) [2])(auStack_138 + uVar22);
            local_228.m_high_color[0] = auVar5[0];
            local_228.m_high_color[1] = auVar5[1];
            local_228.m_low_color[0] = auVar4[0];
            local_228.m_low_color[1] = auVar4[1];
            if ((ushort)auVar4 < (ushort)auVar5) {
              local_228.m_high_color[0] = auVar4[0];
              local_228.m_high_color[1] = auVar4[1];
              local_228.m_low_color[0] = auVar5[0];
              local_228.m_low_color[1] = auVar5[1];
            }
            local_228.m_low_color[0] = local_228.m_low_color[0];
            local_228.m_low_color[1] = local_228.m_low_color[1];
            local_228.m_high_color[0] = local_228.m_high_color[0];
            local_228.m_high_color[1] = local_228.m_high_color[1];
            evaluate_solution(local_180,(dxt1_solution_coordinates *)&local_228,false);
            uVar22 = uVar22 + 1;
          } while (uVar20 != uVar22);
        }
        uVar25 = uVar25 + 1;
      } while (uVar25 != uVar19);
    }
    this = local_180;
    if (cCRNDXTQualityFast < local_180->m_pParams->m_quality) {
      dxt1_block::unpack_color
                (&local_228,(local_180->m_best_solution).m_coords.m_low_color,false,0xff);
      lVar18 = 2;
      do {
        if ((int)(char)(&UNK_001ba91e)[lVar18] + (uint)local_228.m_low_color[0] < 0x20) {
          if ((int)(char)(&UNK_001ba91f)[lVar18] + (uint)local_228.m_low_color[1] < 0x40) {
            if ((int)(char)(&g_adjacency)[lVar18] + (uint)local_228.m_high_color[0] < 0x20) {
              uVar15 = dxt1_block::pack_color
                                 ((int)(char)(&UNK_001ba91e)[lVar18] +
                                  (uint)local_228.m_low_color[0],
                                  (int)(char)(&UNK_001ba91f)[lVar18] +
                                  (uint)local_228.m_low_color[1],
                                  (int)(char)(&g_adjacency)[lVar18] +
                                  (uint)local_228.m_high_color[0],false,0x7f);
              uVar6 = (this->m_best_solution).m_coords.m_high_color;
              local_21c.m_high_color[0] = (char)uVar6;
              local_21c.m_high_color[1] = (char)(uVar6 >> 8);
              local_21c.m_low_color[0] = (char)uVar15;
              local_21c.m_low_color[1] = (char)(uVar15 >> 8);
              if (uVar15 < uVar6) {
                local_21c.m_high_color[0] = (char)uVar15;
                local_21c.m_high_color[1] = (char)(uVar15 >> 8);
                local_21c.m_low_color[0] = (char)uVar6;
                local_21c.m_low_color[1] = (char)(uVar6 >> 8);
              }
              evaluate_solution(this,(dxt1_solution_coordinates *)&local_21c,false);
            }
          }
        }
        lVar18 = lVar18 + 3;
      } while (lVar18 != 0x50);
      if (this->m_pParams->m_quality == cCRNDXTQualityUber) {
        dxt1_block::unpack_color(&local_21c,(this->m_best_solution).m_coords.m_low_color,false,0xff)
        ;
        local_228.m_low_color[0] = local_21c.m_low_color[0];
        local_228.m_low_color[1] = local_21c.m_low_color[1];
        local_228.m_high_color[0] = local_21c.m_high_color[0];
        local_228.m_high_color[1] = local_21c.m_high_color[1];
        lVar18 = 0;
        do {
          iVar23 = -6;
          do {
            dVar11 = local_228;
            local_21c.m_low_color[0] = local_228.m_low_color[0];
            local_21c.m_low_color[1] = local_228.m_low_color[1];
            local_21c.m_high_color[0] = local_228.m_high_color[0];
            local_21c.m_high_color[1] = local_228.m_high_color[1];
            local_228 = dVar11;
            if (iVar23 + (uint)local_21c.m_low_color[lVar18] + 4 <=
                ((uint)(lVar18 == 1) << 5 | 0x1f)) {
              local_21c.m_low_color[lVar18] = local_21c.m_low_color[lVar18] + (char)iVar23 + '\x04';
              uVar15 = dxt1_block::pack_color((color_quad_u8 *)&local_21c,false,0x7f);
              uVar6 = (this->m_best_solution).m_coords.m_high_color;
              local_230.m_high_color[0] = (char)uVar6;
              local_230.m_high_color[1] = (char)(uVar6 >> 8);
              local_230.m_low_color[0] = (char)uVar15;
              local_230.m_low_color[1] = (char)(uVar15 >> 8);
              if (uVar15 < uVar6) {
                local_230.m_high_color[0] = (char)uVar15;
                local_230.m_high_color[1] = (char)(uVar15 >> 8);
                local_230.m_low_color[0] = (char)uVar6;
                local_230.m_low_color[1] = (char)(uVar6 >> 8);
              }
              evaluate_solution(this,(dxt1_solution_coordinates *)&local_230,false);
            }
            iVar23 = iVar23 + 4;
          } while (iVar23 < -1);
          lVar18 = lVar18 + 1;
        } while (lVar18 != 3);
      }
      dxt1_block::unpack_color(&local_21c,(this->m_best_solution).m_coords.m_high_color,false,0xff);
      lVar18 = 2;
      do {
        uVar17 = (int)(char)(&UNK_001ba91e)[lVar18] + (local_21c._0_4_ & 0xff);
        if (((uVar17 < 0x20) &&
            (g = (int)(char)(&UNK_001ba91f)[lVar18] + ((uint)local_21c._0_4_ >> 8 & 0xff), g < 0x40)
            ) && (b = (int)(char)(&g_adjacency)[lVar18] + ((uint)local_21c._0_4_ >> 0x10 & 0xff),
                 b < 0x20)) {
          uVar6 = (this->m_best_solution).m_coords.m_low_color;
          uVar15 = dxt1_block::pack_color(uVar17,g,b,false,0x7f);
          local_230.m_high_color[0] = (char)uVar15;
          local_230.m_high_color[1] = (char)(uVar15 >> 8);
          local_230.m_low_color[0] = (char)uVar6;
          local_230.m_low_color[1] = (char)(uVar6 >> 8);
          if (uVar6 < uVar15) {
            local_230.m_high_color[0] = (char)uVar6;
            local_230.m_high_color[1] = (char)(uVar6 >> 8);
            local_230.m_low_color[0] = (char)uVar15;
            local_230.m_low_color[1] = (char)(uVar15 >> 8);
          }
          evaluate_solution(this,(dxt1_solution_coordinates *)&local_230,false);
        }
        lVar18 = lVar18 + 3;
      } while (lVar18 != 0x50);
      if (this->m_pParams->m_quality == cCRNDXTQualityUber) {
        dxt1_block::unpack_color
                  (&local_230,(this->m_best_solution).m_coords.m_high_color,false,0xff);
        local_21c.m_low_color[0] = local_230.m_low_color[0];
        local_21c.m_low_color[1] = local_230.m_low_color[1];
        local_21c.m_high_color[0] = local_230.m_high_color[0];
        local_21c.m_high_color[1] = local_230.m_high_color[1];
        lVar18 = 0;
        do {
          iVar23 = -6;
          do {
            local_230.m_low_color[0] = local_21c.m_low_color[0];
            local_230.m_low_color[1] = local_21c.m_low_color[1];
            local_230.m_high_color[0] = local_21c.m_high_color[0];
            local_230.m_high_color[1] = local_21c.m_high_color[1];
            if (iVar23 + (uint)local_230.m_low_color[lVar18] + 4 <=
                ((uint)(lVar18 == 1) << 5 | 0x1f)) {
              local_230.m_low_color[lVar18] = local_230.m_low_color[lVar18] + (char)iVar23 + '\x04';
              uVar6 = (this->m_best_solution).m_coords.m_low_color;
              local_20c.m_high_color =
                   dxt1_block::pack_color((color_quad_u8 *)&local_230,false,0x7f);
              local_20c.m_low_color = uVar6;
              if (uVar6 < local_20c.m_high_color) {
                local_20c.m_low_color = local_20c.m_high_color;
                local_20c.m_high_color = uVar6;
              }
              evaluate_solution(this,&local_20c,false);
            }
            iVar23 = iVar23 + 4;
          } while (iVar23 < -1);
          lVar18 = lVar18 + 1;
        } while (lVar18 != 3);
      }
    }
    iVar23 = local_1ac;
    uVar9 = (this->m_best_solution).m_error;
    if ((uVar9 == 0) || (local_1ac != 0 && uVar9 == local_168)) break;
    if (cCRNDXTQualityBetter < this->m_pParams->m_quality) {
      refine_solution(this,1);
    }
    iVar23 = iVar23 + 1;
    if (iVar23 == local_1d0[3]) break;
  }
  if (this->m_pParams->m_quality < cCRNDXTQualityNormal) goto LAB_001790dd;
  if (((this->m_best_solution).m_error != 0) && (this->m_pParams->m_pixels_have_alpha == false)) {
    uVar17 = (this->m_best_solution).m_selectors.m_size;
    if ((ulong)uVar17 != 0) {
      if (uVar17 != 1) {
        puVar10 = (this->m_best_solution).m_selectors.m_p;
        uVar20 = 1;
        do {
          if (puVar10[uVar20] != *puVar10) goto LAB_001790af;
          uVar20 = uVar20 + 1;
        } while (uVar17 != uVar20);
      }
      bVar26 = try_average_block_as_solid(this);
      if (bVar26) goto LAB_001790c1;
    }
LAB_001790af:
    if (this->m_pParams->m_quality == cCRNDXTQualityUber) {
      optimize_endpoint_comps(this);
    }
  }
LAB_001790c1:
  if ((this->m_pParams->m_quality == cCRNDXTQualityUber) && ((this->m_best_solution).m_error != 0))
  {
    try_combinatorial_encoding(this);
  }
LAB_001790dd:
  return_solution(this);
  if (this->m_pParams->m_endpoint_caching == true) {
    uVar17 = this->m_num_prev_results;
    this->m_prev_results[uVar17 & 3] = (this->m_best_solution).m_coords;
    this->m_num_prev_results = uVar17 + 1;
  }
  if (local_1f8.m_p != (void *)0x0) {
    crnlib_free(local_1f8.m_p);
  }
  return;
}

Assistant:

void dxt1_endpoint_optimizer::optimize_endpoints(vec3F& low_color, vec3F& high_color) {
  vec3F orig_low_color(low_color);
  vec3F orig_high_color(high_color);

  m_trial_solution.clear();

  uint num_passes;
  const int16* pProbe_table = g_uber_probe_table;
  uint probe_range;
  float dist_per_trial = .015625f;

  // How many probes, and the distance between each probe depends on the quality level.
  switch (m_pParams->m_quality) {
    case cCRNDXTQualitySuperFast:
      pProbe_table = g_fast_probe_table;
      probe_range = cFastProbeTableSize;
      dist_per_trial = .027063293f;
      num_passes = 1;
      break;
    case cCRNDXTQualityFast:
      pProbe_table = g_fast_probe_table;
      probe_range = cFastProbeTableSize;
      dist_per_trial = .027063293f;
      num_passes = 2;
      break;
    case cCRNDXTQualityNormal:
      pProbe_table = g_normal_probe_table;
      probe_range = cNormalProbeTableSize;
      dist_per_trial = .027063293f;
      num_passes = 2;
      break;
    case cCRNDXTQualityBetter:
      pProbe_table = g_better_probe_table;
      probe_range = cBetterProbeTableSize;
      num_passes = 2;
      break;
    default:
      pProbe_table = g_uber_probe_table;
      probe_range = cUberProbeTableSize;
      num_passes = 4;
      break;
  }

  if (m_pParams->m_endpoint_caching) {
    // Try the previous X winning endpoints. This may not give us optimal results, but it may increase the probability of early outs while evaluating potential solutions.
    const uint num_prev_results = math::minimum<uint>(cMaxPrevResults, m_num_prev_results);
    for (uint i = 0; i < num_prev_results; i++)
      evaluate_solution(m_prev_results[i]);

    if (!m_best_solution.m_error) {
      // Got lucky - one of the previous endpoints is optimal.
      return_solution();
      return;
    }
  }

  if (m_pParams->m_quality >= cCRNDXTQualityBetter) {
    //evaluate_solution(dxt1_solution_coordinates(low_color, high_color), true, &m_best_solution);
    //refine_solution();

    try_median4(orig_low_color, orig_high_color);
  }

  uint probe_low[cUberProbeTableSize * 2 + 1];
  uint probe_high[cUberProbeTableSize * 2 + 1];

  vec3F scaled_principle_axis[2];

  scaled_principle_axis[1] = m_principle_axis * dist_per_trial;
  scaled_principle_axis[1][0] *= 31.0f;
  scaled_principle_axis[1][1] *= 63.0f;
  scaled_principle_axis[1][2] *= 31.0f;

  scaled_principle_axis[0] = -scaled_principle_axis[1];

  //vec3F initial_ofs(scaled_principle_axis * (float)-probe_range);
  //initial_ofs[0] += .5f;
  //initial_ofs[1] += .5f;
  //initial_ofs[2] += .5f;

  low_color[0] = math::clamp(low_color[0] * 31.0f, 0.0f, 31.0f);
  low_color[1] = math::clamp(low_color[1] * 63.0f, 0.0f, 63.0f);
  low_color[2] = math::clamp(low_color[2] * 31.0f, 0.0f, 31.0f);

  high_color[0] = math::clamp(high_color[0] * 31.0f, 0.0f, 31.0f);
  high_color[1] = math::clamp(high_color[1] * 63.0f, 0.0f, 63.0f);
  high_color[2] = math::clamp(high_color[2] * 31.0f, 0.0f, 31.0f);

  int d[3];
  for (uint c = 0; c < 3; c++)
    d[c] = math::float_to_int_round((high_color[c] - low_color[c]) * (c == 0 ? m_perceptual ? 16 : 2 : c == 1 ? m_perceptual ? 25 : 1 : 2));
  crnlib::vector<unique_color_projection> evaluated_color_projections(m_evaluated_colors.size());
  int64 average_projection = d[0] * (high_color[0] + low_color[0]) * 4 + d[1] * (high_color[1] + low_color[1]) * 2 + d[2] * (high_color[2] + low_color[2]) * 4;
  for (uint i = 0; i < m_evaluated_colors.size(); i++) {
    int64 delta = d[0] * m_evaluated_colors[i].m_color[0] + d[1] * m_evaluated_colors[i].m_color[1] + d[2] * m_evaluated_colors[i].m_color[2] - average_projection;
    evaluated_color_projections[i].projection = delta * m_evaluated_colors[i].m_weight;
    evaluated_color_projections[i].color = m_evaluated_colors[i];
  }
  std::sort(evaluated_color_projections.begin(), evaluated_color_projections.end(), g_unique_color_projection_sort);
  for (uint i = 0, iEnd = m_evaluated_colors.size(); i < iEnd; i++)
    m_evaluated_colors[i] = evaluated_color_projections[i & 1 ? i >> 1 : iEnd - 1 - (i >> 1)].color;

  for (uint pass = 0; pass < num_passes; pass++) {
    // Now separately sweep or probe the low and high colors along the principle axis, both positively and negatively.
    // This results in two arrays of candidate low/high endpoints. Every unique combination of candidate endpoints is tried as a potential solution.
    // In higher quality modes, the various nearby lattice neighbors of each candidate endpoint are also explored, which allows the current solution to "wobble" or "migrate"
    // to areas with lower error.
    // This entire process can be repeated up to X times (depending on the quality level) until a local minimum is established.
    // This method is very stable and scalable. It could be implemented more elegantly, but I'm now very cautious of touching this code.
    if (pass) {
      color_quad_u8 low(dxt1_block::unpack_color(m_best_solution.m_coords.m_low_color, false));
      low_color = vec3F(low.r, low.g, low.b);
      color_quad_u8 high(dxt1_block::unpack_color(m_best_solution.m_coords.m_high_color, false));
      high_color = vec3F(high.r, high.g, high.b);
    }

    const uint64 prev_best_error = m_best_solution.m_error;
    if (!prev_best_error)
      break;

    // Sweep low endpoint along principle axis, record positions
    int prev_packed_color[2] = {-1, -1};
    uint num_low_trials = 0;
    vec3F initial_probe_low_color(low_color + vec3F(.5f));
    for (uint i = 0; i < probe_range; i++) {
      const int ls = i ? 0 : 1;
      int x = pProbe_table[i];

      for (int s = ls; s < 2; s++) {
        vec3F probe_low_color(initial_probe_low_color + scaled_principle_axis[s] * (float)x);

        int r = math::clamp((int)floor(probe_low_color[0]), 0, 31);
        int g = math::clamp((int)floor(probe_low_color[1]), 0, 63);
        int b = math::clamp((int)floor(probe_low_color[2]), 0, 31);

        int packed_color = b | (g << 5U) | (r << 11U);
        if (packed_color != prev_packed_color[s]) {
          probe_low[num_low_trials++] = packed_color;
          prev_packed_color[s] = packed_color;
        }
      }
    }

    prev_packed_color[0] = -1;
    prev_packed_color[1] = -1;

    // Sweep high endpoint along principle axis, record positions
    uint num_high_trials = 0;
    vec3F initial_probe_high_color(high_color + vec3F(.5f));
    for (uint i = 0; i < probe_range; i++) {
      const int ls = i ? 0 : 1;
      int x = pProbe_table[i];

      for (int s = ls; s < 2; s++) {
        vec3F probe_high_color(initial_probe_high_color + scaled_principle_axis[s] * (float)x);

        int r = math::clamp((int)floor(probe_high_color[0]), 0, 31);
        int g = math::clamp((int)floor(probe_high_color[1]), 0, 63);
        int b = math::clamp((int)floor(probe_high_color[2]), 0, 31);

        int packed_color = b | (g << 5U) | (r << 11U);
        if (packed_color != prev_packed_color[s]) {
          probe_high[num_high_trials++] = packed_color;
          prev_packed_color[s] = packed_color;
        }
      }
    }

    // Now try all unique combinations.
    for (uint i = 0; i < num_low_trials; i++) {
      for (uint j = 0; j < num_high_trials; j++) {
        dxt1_solution_coordinates coords((uint16)probe_low[i], (uint16)probe_high[j]);
        coords.canonicalize();
        evaluate_solution(coords);
      }
    }

    if (m_pParams->m_quality >= cCRNDXTQualityNormal) {
      // Generate new candidates by exploring the low color's direct lattice neighbors
      color_quad_u8 lc(dxt1_block::unpack_color(m_best_solution.m_coords.m_low_color, false));

      for (int i = 0; i < 26; i++) {
        int r = lc.r + g_adjacency[i].x;
        if ((r < 0) || (r > 31))
          continue;

        int g = lc.g + g_adjacency[i].y;
        if ((g < 0) || (g > 63))
          continue;

        int b = lc.b + g_adjacency[i].z;
        if ((b < 0) || (b > 31))
          continue;

        dxt1_solution_coordinates coords(dxt1_block::pack_color(r, g, b, false), m_best_solution.m_coords.m_high_color);
        coords.canonicalize();
        evaluate_solution(coords);
      }

      if (m_pParams->m_quality == cCRNDXTQualityUber) {
        // Generate new candidates by exploring the low color's direct lattice neighbors - this time, explore much further separately on each axis.
        lc = dxt1_block::unpack_color(m_best_solution.m_coords.m_low_color, false);

        for (int a = 0; a < 3; a++) {
          int limit = (a == 1) ? 63 : 31;

          for (int s = -2; s <= 2; s += 4) {
            color_quad_u8 c(lc);
            int q = c[a] + s;
            if ((q < 0) || (q > limit))
              continue;

            c[a] = (uint8)q;

            dxt1_solution_coordinates coords(dxt1_block::pack_color(c, false), m_best_solution.m_coords.m_high_color);
            coords.canonicalize();
            evaluate_solution(coords);
          }
        }
      }

      // Generate new candidates by exploring the high color's direct lattice neighbors
      color_quad_u8 hc(dxt1_block::unpack_color(m_best_solution.m_coords.m_high_color, false));

      for (int i = 0; i < 26; i++) {
        int r = hc.r + g_adjacency[i].x;
        if ((r < 0) || (r > 31))
          continue;

        int g = hc.g + g_adjacency[i].y;
        if ((g < 0) || (g > 63))
          continue;

        int b = hc.b + g_adjacency[i].z;
        if ((b < 0) || (b > 31))
          continue;

        dxt1_solution_coordinates coords(m_best_solution.m_coords.m_low_color, dxt1_block::pack_color(r, g, b, false));
        coords.canonicalize();
        evaluate_solution(coords);
      }

      if (m_pParams->m_quality == cCRNDXTQualityUber) {
        // Generate new candidates by exploring the high color's direct lattice neighbors - this time, explore much further separately on each axis.
        hc = dxt1_block::unpack_color(m_best_solution.m_coords.m_high_color, false);

        for (int a = 0; a < 3; a++) {
          int limit = (a == 1) ? 63 : 31;

          for (int s = -2; s <= 2; s += 4) {
            color_quad_u8 c(hc);
            int q = c[a] + s;
            if ((q < 0) || (q > limit))
              continue;

            c[a] = (uint8)q;

            dxt1_solution_coordinates coords(m_best_solution.m_coords.m_low_color, dxt1_block::pack_color(c, false));
            coords.canonicalize();
            evaluate_solution(coords);
          }
        }
      }
    }

    if ((!m_best_solution.m_error) || ((pass) && (m_best_solution.m_error == prev_best_error)))
      break;

    if (m_pParams->m_quality >= cCRNDXTQualityUber) {
      // Attempt to refine current solution's endpoints given the current selectors using least squares.
      refine_solution(1);
    }
  }

  if (m_pParams->m_quality >= cCRNDXTQualityNormal) {
    if ((m_best_solution.m_error) && (!m_pParams->m_pixels_have_alpha)) {
      bool choose_solid_block = false;
      if (m_best_solution.are_selectors_all_equal()) {
        // All selectors equal - try various solid-block optimizations
        choose_solid_block = try_average_block_as_solid();
      }

      if ((!choose_solid_block) && (m_pParams->m_quality == cCRNDXTQualityUber)) {
        // Per-component 1D endpoint optimization.
        optimize_endpoint_comps();
      }
    }

    if (m_pParams->m_quality == cCRNDXTQualityUber) {
      if (m_best_solution.m_error) {
        // The pixels may have already been DXTc compressed by another compressor.
        // It's usually possible to recover the endpoints used to previously pack the block.
        try_combinatorial_encoding();
      }
    }
  }

  return_solution();

  if (m_pParams->m_endpoint_caching) {
    // Remember result for later reruse.
    m_prev_results[m_num_prev_results & (cMaxPrevResults - 1)] = m_best_solution.m_coords;
    m_num_prev_results++;
  }
}